

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utBlenderWork.cpp
# Opt level: O3

void __thiscall BlenderWorkTest_work_279_Test::TestBody(BlenderWorkTest_work_279_Test *this)

{
  internal iVar1;
  aiScene *paVar2;
  char *pcVar3;
  char *in_R9;
  bool bVar4;
  bool bVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  AssertHelper local_48;
  Message local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string local_30;
  
  paVar2 = Assimp::Importer::ReadFile
                     ((this->super_BlenderWorkTest).im,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/BLEND/test_279.blend"
                      ,0x400);
  iVar1 = (internal)(paVar2 != (aiScene *)0x0);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.ss_.ptr_._0_1_ = iVar1;
  if (paVar2 == (aiScene *)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_40,(AssertionResult *)"pTest != NULL","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlenderWork.cpp"
               ,0x44,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                      (char)local_30._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar4 = paVar2->mMaterials != (aiMaterial **)0x0;
    bVar5 = paVar2->mNumMaterials != 0;
    local_40.ss_.ptr_._0_1_ = (internal)(bVar5 && bVar4);
    local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar5 && bVar4) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bVar4 = paVar2->mMeshes != (aiMesh **)0x0;
      bVar5 = paVar2->mNumMeshes != 0;
      local_40.ss_.ptr_._0_1_ = (internal)(bVar5 && bVar4);
      local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar5 && bVar4) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar4 = (*paVar2->mMeshes)->mNumVertices == 0;
        local_40.ss_.ptr_._0_4_ = CONCAT31(local_40.ss_.ptr_._1_3_,!bVar4);
        local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar4) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)&local_40,
                     (AssertionResult *)"pTest->mMeshes[0]->mNumVertices > 0","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlenderWork.cpp"
                     ,0x49,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                            (char)local_30._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p
                                    ));
          }
          if (local_50.data_ != (AssertHelperData *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_50.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_50.data_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_40.ss_.ptr_._0_4_ = 0x2c;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&local_30,"44u","pTest->mMeshes[0]->mNumFaces",(uint *)&local_40,
                     &(*paVar2->mMeshes)->mNumFaces);
          if ((char)local_30._M_dataplus._M_p == '\0') {
            testing::Message::Message(&local_40);
            if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)local_30._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlenderWork.cpp"
                       ,0x4a,pcVar3);
            testing::internal::AssertHelper::operator=(&local_50,&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if (CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != 0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 ((long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_30._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_30._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_40.ss_.ptr_._0_4_ = 1;
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&local_30,"1u","pTest->mNumMaterials",(uint *)&local_40,
                       &paVar2->mNumMaterials);
            if ((char)local_30._M_dataplus._M_p == '\0') {
              testing::Message::Message(&local_40);
              if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)local_30._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlenderWork.cpp"
                         ,0x4b,pcVar3);
              testing::internal::AssertHelper::operator=(&local_50,&local_40);
              testing::internal::AssertHelper::~AssertHelper(&local_50);
              if (CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != 0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) &&
                   ((long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != (long *)0x0
                   )) {
                  (**(code **)(*(long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) +
                              8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_30._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,(internal *)&local_40,(AssertionResult *)"pTest->HasMeshes()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlenderWork.cpp"
                   ,0x48,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                          (char)local_30._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
            &local_30.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p))
          ;
        }
        if (local_50.data_ != (AssertHelperData *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (local_50.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    else {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,(internal *)&local_40,(AssertionResult *)"pTest->HasMaterials()","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlenderWork.cpp"
                 ,0x47,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                        (char)local_30._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
          &local_30.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST_F(BlenderWorkTest,work_279) {
    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/BLEND/test_279.blend", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest != NULL);

    // material has 2 diffuse textures
    ASSERT_TRUE(pTest->HasMaterials());
    ASSERT_TRUE(pTest->HasMeshes());
    ASSERT_TRUE(pTest->mMeshes[0]->mNumVertices > 0);
    ASSERT_EQ(44u, pTest->mMeshes[0]->mNumFaces);
    EXPECT_EQ(1u, pTest->mNumMaterials);
}